

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall
Catch::TestCaseTracking::NameAndLocation::NameAndLocation
          (NameAndLocation *this,string *_name,SourceLineInfo *_location)

{
  undefined8 *in_RDX;
  string *in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  *(undefined8 *)(in_RDI + 0x20) = *in_RDX;
  *(undefined8 *)(in_RDI + 0x28) = in_RDX[1];
  return;
}

Assistant:

NameAndLocation::NameAndLocation( std::string const& _name, SourceLineInfo const& _location )
    :   name( _name ),
        location( _location )
    {}